

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libntlmconnect.c
# Opt level: O1

int test(char *url)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  void *__ptr;
  undefined8 uVar6;
  long lVar7;
  CURL *pCVar8;
  long lVar9;
  char *pcVar10;
  undefined8 uVar11;
  CURL **ppCVar12;
  undefined8 uVar13;
  int *piVar14;
  ulong uVar15;
  bool bVar16;
  timeval tVar17;
  int running;
  int maxfd;
  long timeout;
  timeval interval;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  int local_1f0;
  int local_1e8;
  int local_1e4;
  void *local_1e0;
  long local_1d8;
  char *local_1d0;
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  local_1d0 = url;
  sVar5 = strlen(url);
  sVar5 = sVar5 + 5;
  __ptr = malloc(sVar5);
  tv_test_start = tutil_tvnow();
  if (__ptr == (void *)0x0) {
    curl_mfprintf(_stderr,"Not enough memory for full url\n");
    local_1f0 = 0x7e;
  }
  else {
    easy[0] = (CURL *)0x0;
    easy[1] = (CURL *)0x0;
    easy[2] = (CURL *)0x0;
    sockets[0] = -1;
    sockets[1] = -1;
    sockets[2] = -1;
    iVar2 = curl_global_init(3);
    uVar13 = _stderr;
    if (iVar2 != 0) {
      uVar6 = curl_easy_strerror(iVar2);
      curl_mfprintf(uVar13,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/libntlmconnect.c"
                    ,0x6e,iVar2,uVar6);
      res = iVar2;
    }
    local_1f0 = res;
    if (res == 0) {
      local_1e0 = __ptr;
      lVar7 = curl_multi_init();
      if (lVar7 == 0) {
        curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/libntlmconnect.c"
                      ,0x74);
        res = 0x7b;
      }
      if (res == 0) {
        cVar1 = '\0';
        local_1f0 = 0;
        do {
          local_1d8 = -99;
          local_1e4 = -99;
          if (cVar1 == '\0') {
            pCVar8 = (CURL *)curl_easy_init();
            easy[local_1f0] = pCVar8;
            if (pCVar8 == (CURL *)0x0) {
              curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/libntlmconnect.c"
                            ,0x87);
              res = 0x7c;
            }
            cVar1 = '\0';
            iVar2 = 0xd;
            if (res == 0) {
              if (local_1f0 % 3 == 2) {
                curl_msnprintf(local_1e0,sVar5,"%s0200",local_1d0);
                iVar3 = curl_easy_setopt(easy[local_1f0],0x6b,8);
                uVar13 = _stderr;
                if (iVar3 != 0) {
                  uVar6 = curl_easy_strerror(iVar3);
                  uVar11 = 0x8b;
LAB_00102717:
                  curl_mfprintf(uVar13,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/libntlmconnect.c"
                                ,uVar11,iVar3,uVar6);
                  res = iVar3;
                }
              }
              else {
                curl_msnprintf(local_1e0,sVar5,"%s0100",local_1d0);
                iVar3 = curl_easy_setopt(easy[local_1f0],0x6b,1);
                uVar13 = _stderr;
                if (iVar3 != 0) {
                  uVar6 = curl_easy_strerror(iVar3);
                  uVar11 = 0x8f;
                  goto LAB_00102717;
                }
              }
              if (res != 0) goto LAB_00102528;
              iVar3 = curl_easy_setopt(easy[local_1f0],0x4a,1);
              uVar13 = _stderr;
              if (iVar3 != 0) {
                uVar6 = curl_easy_strerror(iVar3);
                curl_mfprintf(uVar13,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/libntlmconnect.c"
                              ,0x91,iVar3,uVar6);
                res = iVar3;
              }
              if (res == 0) {
                iVar3 = curl_easy_setopt(easy[local_1f0],0x2712,local_1e0);
                uVar13 = _stderr;
                if (iVar3 != 0) {
                  uVar6 = curl_easy_strerror(iVar3);
                  curl_mfprintf(uVar13,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/libntlmconnect.c"
                                ,0x92,iVar3,uVar6);
                  res = iVar3;
                }
                if (res == 0) {
                  iVar3 = curl_easy_setopt(easy[local_1f0],0x29,1);
                  uVar13 = _stderr;
                  if (iVar3 != 0) {
                    uVar6 = curl_easy_strerror(iVar3);
                    curl_mfprintf(uVar13,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/libntlmconnect.c"
                                  ,0x93,iVar3,uVar6);
                    res = iVar3;
                  }
                  if (res == 0) {
                    iVar2 = curl_easy_setopt(easy[local_1f0],0x50,1);
                    uVar13 = _stderr;
                    if (iVar2 != 0) {
                      uVar6 = curl_easy_strerror(iVar2);
                      curl_mfprintf(uVar13,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/libntlmconnect.c"
                                    ,0x94,iVar2,uVar6);
                      res = iVar2;
                    }
                    if (res == 0) {
                      iVar2 = curl_easy_setopt(easy[local_1f0],0x2715,"testuser:testpass");
                      uVar13 = _stderr;
                      if (iVar2 != 0) {
                        uVar6 = curl_easy_strerror(iVar2);
                        curl_mfprintf(uVar13,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/libntlmconnect.c"
                                      ,0x95,iVar2,uVar6);
                        res = iVar2;
                      }
                      if (res == 0) {
                        iVar2 = curl_easy_setopt(easy[local_1f0],0x4e2b,callback);
                        uVar13 = _stderr;
                        if (iVar2 != 0) {
                          uVar6 = curl_easy_strerror(iVar2);
                          curl_mfprintf(uVar13,
                                        "%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/libntlmconnect.c"
                                        ,0x96,iVar2,uVar6);
                          res = iVar2;
                        }
                        if (res == 0) {
                          iVar2 = curl_easy_setopt(easy[local_1f0],0x2711);
                          uVar13 = _stderr;
                          if (iVar2 != 0) {
                            uVar6 = curl_easy_strerror(iVar2);
                            curl_mfprintf(uVar13,
                                          "%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/libntlmconnect.c"
                                          ,0x97,iVar2,uVar6);
                            res = iVar2;
                          }
                          if (res == 0) {
                            iVar2 = curl_easy_setopt(easy[local_1f0],0x2a,1);
                            uVar13 = _stderr;
                            if (iVar2 != 0) {
                              uVar6 = curl_easy_strerror(iVar2);
                              curl_mfprintf(uVar13,
                                            "%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/libntlmconnect.c"
                                            ,0x98,iVar2,uVar6);
                              res = iVar2;
                            }
                            if (res == 0) {
                              iVar2 = curl_multi_add_handle(lVar7,easy[local_1f0]);
                              uVar13 = _stderr;
                              if (iVar2 != 0) {
                                uVar6 = curl_multi_strerror(iVar2);
                                curl_mfprintf(uVar13,
                                              "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/libntlmconnect.c"
                                              ,0x9a,iVar2,uVar6);
                                res = iVar2;
                              }
                              if (res == 0) {
                                local_1f0 = local_1f0 + 1;
                                cVar1 = '\x01';
                                goto LAB_0010244d;
                              }
                            }
                          }
                        }
                      }
                    }
                    goto LAB_00102528;
                  }
                }
              }
            }
          }
          else {
LAB_0010244d:
            iVar2 = curl_multi_perform(lVar7,&local_1e8);
            uVar13 = _stderr;
            if (iVar2 == 0) {
              if (local_1e8 < 0) {
                curl_mfprintf(_stderr,
                              "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/libntlmconnect.c"
                              ,0x9f);
                res = 0x7a;
              }
            }
            else {
              uVar6 = curl_multi_strerror(iVar2);
              curl_mfprintf(uVar13,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/libntlmconnect.c"
                            ,0x9f,iVar2,uVar6);
              res = iVar2;
            }
            if (res != 0) goto LAB_00102528;
            curl_mfprintf(_stderr,"%s:%d running %d state %d\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/libntlmconnect.c"
                          ,0xa2,local_1e8,cVar1);
            tVar17 = tutil_tvnow();
            lVar9 = tutil_tvdiff(tVar17,tv_test_start);
            if (5000 < lVar9) {
              curl_mfprintf(_stderr,
                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/libntlmconnect.c"
                            ,0xa4);
              res = 0x7d;
            }
            iVar2 = 0xd;
            if (res == 0) {
              if ((cVar1 == '\x02') && (local_1e8 == 0)) {
                cVar1 = '\x02';
                iVar2 = 0xe;
              }
              else {
                local_b8.__fds_bits[0xe] = 0;
                local_b8.__fds_bits[0xf] = 0;
                local_b8.__fds_bits[0xc] = 0;
                local_b8.__fds_bits[0xd] = 0;
                local_b8.__fds_bits[10] = 0;
                local_b8.__fds_bits[0xb] = 0;
                local_b8.__fds_bits[8] = 0;
                local_b8.__fds_bits[9] = 0;
                local_b8.__fds_bits[6] = 0;
                local_b8.__fds_bits[7] = 0;
                local_b8.__fds_bits[4] = 0;
                local_b8.__fds_bits[5] = 0;
                local_b8.__fds_bits[2] = 0;
                local_b8.__fds_bits[3] = 0;
                local_b8.__fds_bits[0] = 0;
                local_b8.__fds_bits[1] = 0;
                local_138.__fds_bits[0] = 0;
                local_138.__fds_bits[1] = 0;
                local_138.__fds_bits[2] = 0;
                local_138.__fds_bits[3] = 0;
                local_138.__fds_bits[4] = 0;
                local_138.__fds_bits[5] = 0;
                local_138.__fds_bits[6] = 0;
                local_138.__fds_bits[7] = 0;
                local_138.__fds_bits[8] = 0;
                local_138.__fds_bits[9] = 0;
                local_138.__fds_bits[10] = 0;
                local_138.__fds_bits[0xb] = 0;
                local_138.__fds_bits[0xc] = 0;
                local_138.__fds_bits[0xd] = 0;
                local_138.__fds_bits[0xe] = 0;
                local_138.__fds_bits[0xf] = 0;
                local_1b8.__fds_bits[0] = 0;
                local_1b8.__fds_bits[1] = 0;
                local_1b8.__fds_bits[2] = 0;
                local_1b8.__fds_bits[3] = 0;
                local_1b8.__fds_bits[4] = 0;
                local_1b8.__fds_bits[5] = 0;
                local_1b8.__fds_bits[6] = 0;
                local_1b8.__fds_bits[7] = 0;
                local_1b8.__fds_bits[8] = 0;
                local_1b8.__fds_bits[9] = 0;
                local_1b8.__fds_bits[10] = 0;
                local_1b8.__fds_bits[0xb] = 0;
                local_1b8.__fds_bits[0xc] = 0;
                local_1b8.__fds_bits[0xd] = 0;
                local_1b8.__fds_bits[0xe] = 0;
                local_1b8.__fds_bits[0xf] = 0;
                iVar3 = curl_multi_fdset(lVar7,&local_b8,&local_138,&local_1b8,&local_1e4);
                uVar13 = _stderr;
                if (iVar3 == 0) {
                  if (local_1e4 < -1) {
                    curl_mfprintf(_stderr,
                                  "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/libntlmconnect.c"
                                  ,0xad);
                    res = 0x7a;
                  }
                }
                else {
                  uVar6 = curl_multi_strerror(iVar3);
                  curl_mfprintf(uVar13,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/libntlmconnect.c"
                                ,0xad,iVar3,uVar6);
                  res = iVar3;
                }
                if (res == 0) {
                  bVar16 = cVar1 == '\x01';
                  cVar1 = '\x02';
                  if (bVar16) {
                    if (local_1e4 != -1) {
                      curl_mfprintf(_stderr,
                                    "Warning: socket did not open immediately for new handle (trying again)\n"
                                   );
                      cVar1 = '\x01';
                      iVar2 = 0xf;
                      goto LAB_001025d2;
                    }
                    cVar1 = (2 < local_1f0) * '\x02';
                    curl_mfprintf(_stderr,"%s:%d new state %d\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/libntlmconnect.c"
                                  ,0xba);
                  }
                  iVar3 = curl_multi_timeout(lVar7,&local_1d8);
                  uVar13 = _stderr;
                  if (iVar3 == 0) {
                    if (local_1d8 < -1) {
                      curl_mfprintf(_stderr,
                                    "%s:%d curl_multi_timeout() succeeded, but returned invalid timeout value (%ld)\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/libntlmconnect.c"
                                    ,0xbd);
                      res = 0x73;
                    }
                  }
                  else {
                    uVar6 = curl_multi_strerror(iVar3);
                    curl_mfprintf(uVar13,"%s:%d curl_multi_timeout() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/libntlmconnect.c"
                                  ,0xbd,iVar3,uVar6);
                    res = iVar3;
                  }
                  if (res == 0) {
                    iVar3 = local_1e8;
                    curl_mfprintf(_stderr,"%s:%d num_handles %d timeout %ld running %d\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/libntlmconnect.c"
                                  ,0xc2,local_1f0,local_1d8,local_1e8);
                    if (local_1d8 == -1) {
                      local_1c8.tv_sec = 0;
                      local_1c8.tv_usec = 5000;
                      if (local_1f0 == 3 && local_1e8 == 0) {
                        local_1f0 = 3;
                        iVar2 = 0xe;
                        goto LAB_001025d2;
                      }
                    }
                    else {
                      lVar9 = local_1d8;
                      if (0x7ffffffe < local_1d8) {
                        lVar9 = 0x7fffffff;
                      }
                      local_1c8.tv_sec = (__time_t)((int)lVar9 / 1000);
                      local_1c8.tv_usec = (__suseconds_t)(((int)lVar9 % 1000) * 1000);
                    }
                    iVar4 = select_wrapper(local_1e4 + 1,&local_b8,&local_138,&local_1b8,&local_1c8)
                    ;
                    if (iVar4 == -1) {
                      piVar14 = __errno_location();
                      uVar13 = _stderr;
                      iVar4 = *piVar14;
                      pcVar10 = strerror(iVar4);
                      curl_mfprintf(uVar13,"%s:%d select() failed, with errno %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/libntlmconnect.c"
                                    ,0xd5,iVar4,pcVar10,iVar3);
                      res = 0x79;
                    }
                    if (res == 0) {
                      tVar17 = tutil_tvnow();
                      lVar9 = tutil_tvdiff(tVar17,tv_test_start);
                      if (5000 < lVar9) {
                        curl_mfprintf(_stderr,
                                      "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/libntlmconnect.c"
                                      ,0xd7);
                        res = 0x7d;
                      }
                      iVar2 = res;
                      if (res != 0) {
                        iVar2 = 0xd;
                      }
                    }
                    goto LAB_001025d2;
                  }
                }
LAB_00102528:
                iVar2 = 0xd;
              }
            }
          }
LAB_001025d2:
        } while ((iVar2 == 0) || (iVar2 == 0xf));
        if (1 < iVar2 - 0xdU) goto LAB_00102fac;
      }
      ppCVar12 = easy;
      piVar14 = counter;
      uVar15 = 0;
      do {
        curl_mprintf("Data connection %d: %d\n",uVar15 & 0xffffffff,*piVar14);
        curl_multi_remove_handle(lVar7,*ppCVar12);
        curl_easy_cleanup(*ppCVar12);
        uVar15 = uVar15 + 1;
        ppCVar12 = ppCVar12 + 1;
        piVar14 = piVar14 + 1;
      } while (uVar15 != 3);
      curl_multi_cleanup(lVar7);
      curl_global_cleanup();
      free(local_1e0);
      local_1f0 = res;
    }
    else {
      free(__ptr);
    }
  }
LAB_00102fac:
  return local_1f0;
}

Assistant:

int test(char *url)
{
  CURLM *multi = NULL;
  int running;
  int i;
  int num_handles = 0;
  enum HandleState state = ReadyForNewHandle;
  size_t urllen = strlen(url) + 4 + 1;
  char *full_url = malloc(urllen);

  start_test_timing();

  if(!full_url) {
    fprintf(stderr, "Not enough memory for full url\n");
    return TEST_ERR_MAJOR_BAD;
  }

  for(i = 0; i < MAX_EASY_HANDLES; ++i) {
    easy[i] = NULL;
    sockets[i] = CURL_SOCKET_BAD;
  }

  res_global_init(CURL_GLOBAL_ALL);
  if(res) {
    free(full_url);
    return res;
  }

  multi_init(multi);

#ifdef USE_PIPELINING
  multi_setopt(multi, CURLMOPT_PIPELINING, 1L);
  multi_setopt(multi, CURLMOPT_MAX_HOST_CONNECTIONS, 5L);
  multi_setopt(multi, CURLMOPT_MAX_TOTAL_CONNECTIONS, 10L);
#endif

  for(;;) {
    struct timeval interval;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    long timeout = -99;
    int maxfd = -99;
    bool found_new_socket = FALSE;

    /* Start a new handle if we aren't at the max */
    if(state == ReadyForNewHandle) {
      easy_init(easy[num_handles]);

      if(num_handles % 3 == 2) {
        msnprintf(full_url, urllen, "%s0200", url);
        easy_setopt(easy[num_handles], CURLOPT_HTTPAUTH, CURLAUTH_NTLM);
      }
      else {
        msnprintf(full_url, urllen, "%s0100", url);
        easy_setopt(easy[num_handles], CURLOPT_HTTPAUTH, CURLAUTH_BASIC);
      }
      easy_setopt(easy[num_handles], CURLOPT_FRESH_CONNECT, 1L);
      easy_setopt(easy[num_handles], CURLOPT_URL, full_url);
      easy_setopt(easy[num_handles], CURLOPT_VERBOSE, 1L);
      easy_setopt(easy[num_handles], CURLOPT_HTTPGET, 1L);
      easy_setopt(easy[num_handles], CURLOPT_USERPWD, "testuser:testpass");
      easy_setopt(easy[num_handles], CURLOPT_WRITEFUNCTION, callback);
      easy_setopt(easy[num_handles], CURLOPT_WRITEDATA, easy + num_handles);
      easy_setopt(easy[num_handles], CURLOPT_HEADER, 1L);

      multi_add_handle(multi, easy[num_handles]);
      num_handles += 1;
      state = NeedSocketForNewHandle;
    }

    multi_perform(multi, &running);

    fprintf(stderr, "%s:%d running %d state %d\n",
            __FILE__, __LINE__, running, state);

    abort_on_test_timeout();

    if(!running && state == NoMoreHandles)
      break; /* done */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    if(state == NeedSocketForNewHandle) {
      if(maxfd != -1 && !found_new_socket) {
        fprintf(stderr, "Warning: socket did not open immediately for new "
                "handle (trying again)\n");
        continue;
      }
      state = num_handles < MAX_EASY_HANDLES ? ReadyForNewHandle
                                             : NoMoreHandles;
      fprintf(stderr, "%s:%d new state %d\n",
              __FILE__, __LINE__, state);
    }

    multi_timeout(multi, &timeout);

    /* At this point, timeout is guaranteed to be greater or equal than -1. */

    fprintf(stderr, "%s:%d num_handles %d timeout %ld running %d\n",
            __FILE__, __LINE__, num_handles, timeout, running);

    if(timeout != -1L) {
      int itimeout = (timeout > (long)INT_MAX) ? INT_MAX : (int)timeout;
      interval.tv_sec = itimeout/1000;
      interval.tv_usec = (itimeout%1000)*1000;
    }
    else {
      interval.tv_sec = 0;
      interval.tv_usec = 5000;

      /* if there's no timeout and we get here on the last handle, we may
         already have read the last part of the stream so waiting makes no
         sense */
      if(!running && num_handles == MAX_EASY_HANDLES) {
        break;
      }
    }

    select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  /* proper cleanup sequence - type PB */

  for(i = 0; i < MAX_EASY_HANDLES; i++) {
    printf("Data connection %d: %d\n", i, counter[i]);
    curl_multi_remove_handle(multi, easy[i]);
    curl_easy_cleanup(easy[i]);
  }

  curl_multi_cleanup(multi);
  curl_global_cleanup();

  free(full_url);

  return res;
}